

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriterSpec::WriteVar(BinaryWriterSpec *this,Var *var)

{
  Stream *this_00;
  bool bVar1;
  char *pcVar2;
  string *str;
  int __c;
  string_view local_28;
  Var *local_18;
  Var *var_local;
  BinaryWriterSpec *this_local;
  
  local_18 = var;
  var_local = (Var *)this;
  bVar1 = Var::is_index(var);
  if (bVar1) {
    this_00 = this->json_stream_;
    pcVar2 = Var::index(local_18,(char *)var,__c);
    Stream::Writef(this_00,"\"%u\"",(ulong)pcVar2 & 0xffffffff);
  }
  else {
    str = Var::name_abi_cxx11_(local_18);
    string_view::string_view(&local_28,str);
    WriteEscapedString(this,local_28);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteVar(const Var& var) {
  if (var.is_index()) {
    json_stream_->Writef("\"%" PRIindex "\"", var.index());
  } else {
    WriteEscapedString(var.name());
  }
}